

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::MaxPooling1D::backward_impl
          (MaxPooling1D *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  std::operator<<((ostream *)&std::cerr,"FIX IMPL6\n");
  abort();
}

Assistant:

void MaxPooling1D::backward_impl(const vector<const Tensor*>& xs,
                  const Tensor& fx,
                  const Tensor& dEdf,
                  unsigned i,
                  Tensor& dEdxi) const {
  cerr << "FIX IMPL6\n"; abort();
#if 0
  const Tensor& x = *xs.front();
  const unsigned x_rows = x.rows();
  Tensor dEdx = Zero(Dim(x_rows, 1));
  const unsigned fx_rows = x_rows / width;
  assert(fx_rows == ind.size());
  assert(fx_rows == dEdf.rows());
  for (unsigned i = 0; i < fx_rows; ++i)
    dEdx(ind[i], 0) = dEdf(i, 0);
  return dEdx;
#endif
}